

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_object.cpp
# Opt level: O0

void __thiscall
Object_KeyNeedingQuoting_Test<wchar_t>::TestBody(Object_KeyNeedingQuoting_Test<wchar_t> *this)

{
  allocator<pstore::dump::object::member> *this_00;
  initializer_list<pstore::dump::object::member> __l;
  bool bVar1;
  char *message;
  member *__n;
  void *__buf;
  member *local_180;
  AssertHelper local_158;
  Message local_150;
  undefined1 local_148 [8];
  AssertionResult gtest_ar;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> expected;
  __string_type actual;
  shared_ptr<pstore::dump::number_long> local_f0;
  shared_ptr<pstore::dump::value> local_e0 [2];
  allocator local_b9;
  string local_b8;
  member *local_98;
  member local_90;
  iterator local_60;
  size_type local_58;
  vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_> local_50;
  undefined1 local_38 [8];
  object v;
  Object_KeyNeedingQuoting_Test<wchar_t> *this_local;
  
  actual.field_2._M_local_buf[3]._3_1_ = 1;
  local_98 = &local_90;
  v._32_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,"  k1",&local_b9);
  pstore::dump::make_number((int)&local_f0);
  std::shared_ptr<pstore::dump::value>::shared_ptr<pstore::dump::number_long,void>
            (local_e0,&local_f0);
  pstore::dump::object::member::member(&local_90,&local_b8,local_e0);
  actual.field_2._M_local_buf[3]._3_1_ = 0;
  local_60 = &local_90;
  local_58 = 1;
  this_00 = (allocator<pstore::dump::object::member> *)((long)&actual.field_2 + 0xe);
  std::allocator<pstore::dump::object::member>::allocator(this_00);
  __l._M_len = local_58;
  __l._M_array = local_60;
  std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::vector
            (&local_50,__l,this_00);
  pstore::dump::object::object((object *)local_38,&local_50);
  std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::~vector
            (&local_50);
  std::allocator<pstore::dump::object::member>::~allocator
            ((allocator<pstore::dump::object::member> *)((long)&actual.field_2 + 0xe));
  __n = &local_90;
  local_180 = (member *)&local_60;
  do {
    local_180 = local_180 + -1;
    pstore::dump::object::member::~member(local_180);
  } while (local_180 != __n);
  std::shared_ptr<pstore::dump::value>::~shared_ptr(local_e0);
  std::shared_ptr<pstore::dump::number_long>::~shared_ptr(&local_f0);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  pstore::dump::value::write((value *)local_38,(int)this + 0x10,__buf,(size_t)__n);
  std::__cxx11::wostringstream::str();
  convert<wchar_t>((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                   &gtest_ar.message_,"\"  k1\" : 0x2a");
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_nullptr>
            ((EqHelper *)local_148,"expected","actual",
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             &gtest_ar.message_,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             ((long)&expected.field_2 + 8));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(&local_150);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_148);
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/dump/test_object.cpp"
               ,0x76,message);
    testing::internal::AssertHelper::operator=(&local_158,&local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    testing::Message::~Message(&local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  std::__cxx11::wstring::~wstring((wstring *)&gtest_ar.message_);
  std::__cxx11::wstring::~wstring((wstring *)((long)&expected.field_2 + 8));
  pstore::dump::object::~object((object *)local_38);
  return;
}

Assistant:

TYPED_TEST (Object, KeyNeedingQuoting) {
    using namespace ::pstore::dump;
    object v{{
        {"  k1", make_number (42)},
    }};
    v.write (this->out);
    auto const actual = this->out.str ();
    auto const expected = convert<TypeParam> ("\"  k1\" : 0x2a");
    EXPECT_EQ (expected, actual);
}